

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

fstream * __thiscall
SharedDirectory::open_readable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  bool bVar1;
  Error *this_00;
  string local_70;
  path local_50;
  string *local_20;
  string *name_local;
  SharedDirectory *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (SharedDirectory *)__return_storage_ptr__;
  bVar1 = can_read_file(this,name);
  if (!bVar1) {
    this_00 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(this_00,"File does not exist");
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  std::__cxx11::string::string((string *)&local_70,(string *)local_20);
  path_in_dir(&local_50,this,&local_70);
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
            (__return_storage_ptr__,&local_50,_S_in);
  boost::filesystem::path::~path(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_readable_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("File does not exist");
  }
  return fstream(path_in_dir(name), std::ios::in);
}